

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O0

int ProcExtsFromExtList(void)

{
  GLubyte *extensionName;
  char *strExtensionName;
  GLuint local_10;
  GLint iNumExtensions;
  GLint iLoop;
  
  strExtensionName._4_4_ = 0;
  if (_ptrc_glGetStringi == (_func_GLubyte_ptr_GLenum_GLuint *)0x0) {
    iNumExtensions = 0;
  }
  else {
    (*_ptrc_glGetIntegerv)(0x821d,(GLint *)((long)&strExtensionName + 4));
    for (local_10 = 0; (int)local_10 < strExtensionName._4_4_; local_10 = local_10 + 1) {
      extensionName = (*_ptrc_glGetStringi)(0x1f03,local_10);
      LoadExtByName((char *)extensionName);
    }
    iNumExtensions = strExtensionName._4_4_;
  }
  return iNumExtensions;
}

Assistant:

static int ProcExtsFromExtList(void)
{
	GLint iLoop;
	GLint iNumExtensions = 0;

	if (_ptrc_glGetStringi == NULL) return 0;

	_ptrc_glGetIntegerv(GL_NUM_EXTENSIONS, &iNumExtensions);

	for(iLoop = 0; iLoop < iNumExtensions; iLoop++)
	{
		const char *strExtensionName = (const char *)_ptrc_glGetStringi(GL_EXTENSIONS, iLoop);
		LoadExtByName(strExtensionName);
	}

	return iNumExtensions;
}